

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatmain.c
# Opt level: O3

uint8 ecx_siigetbyte(ecx_contextt *context,uint16 slave,uint16 address)

{
  uint16 configadr;
  uint32 *puVar1;
  uint8 uVar2;
  int iVar3;
  uint64 uVar4;
  uint uVar5;
  int iVar6;
  ushort uVar7;
  int iVar8;
  ulong uVar9;
  
  if (context->esislave != slave) {
    puVar1 = context->esimap;
    puVar1[0x1c] = 0;
    puVar1[0x1d] = 0;
    puVar1[0x1e] = 0;
    puVar1[0x1f] = 0;
    puVar1[0x18] = 0;
    puVar1[0x19] = 0;
    puVar1[0x1a] = 0;
    puVar1[0x1b] = 0;
    puVar1[0x14] = 0;
    puVar1[0x15] = 0;
    puVar1[0x16] = 0;
    puVar1[0x17] = 0;
    puVar1[0x10] = 0;
    puVar1[0x11] = 0;
    puVar1[0x12] = 0;
    puVar1[0x13] = 0;
    puVar1[0xc] = 0;
    puVar1[0xd] = 0;
    puVar1[0xe] = 0;
    puVar1[0xf] = 0;
    puVar1[8] = 0;
    puVar1[9] = 0;
    puVar1[10] = 0;
    puVar1[0xb] = 0;
    puVar1[4] = 0;
    puVar1[5] = 0;
    puVar1[6] = 0;
    puVar1[7] = 0;
    puVar1[0] = 0;
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
    context->esislave = slave;
  }
  uVar2 = 0xff;
  uVar5 = (uint)address;
  if (uVar5 < 0x1000) {
    if ((context->esimap[address >> 5] >> (uVar5 & 0x1f) & 1) == 0) {
      configadr = context->slavelist[slave].configadr;
      ecx_eeprom2master(context,slave);
      uVar4 = ecx_readeepromFP(context,configadr,address >> 1,20000);
      uVar5 = uVar5 & 0xffe;
      if (context->slavelist[slave].eep_8byte == '\0') {
        *(int *)(context->esibuf + uVar5) = (int)uVar4;
        iVar3 = 4;
      }
      else {
        *(uint64 *)(context->esibuf + uVar5) = uVar4;
        iVar3 = 8;
      }
      puVar1 = context->esimap;
      uVar9 = (ulong)(address >> 5);
      iVar6 = uVar5 - (address & 0xfe0);
      do {
        iVar8 = iVar6 + 1;
        uVar7 = (ushort)iVar8;
        if (0x1f < uVar7) {
          iVar8 = 0;
        }
        puVar1[uVar9] = puVar1[uVar9] | 1 << ((byte)iVar6 & 0x1f);
        iVar3 = iVar3 + -1;
        uVar9 = (ulong)(ushort)(((short)uVar9 + 1) - (ushort)(uVar7 < 0x20));
        iVar6 = iVar8;
      } while (iVar3 != 0);
    }
    uVar2 = context->esibuf[address];
  }
  return uVar2;
}

Assistant:

uint8 ecx_siigetbyte(ecx_contextt *context, uint16 slave, uint16 address)
{
   uint16 configadr, eadr;
   uint64 edat;
   uint16 mapw, mapb;
   int lp,cnt;
   uint8 retval;

   retval = 0xff;
   if (slave != context->esislave) /* not the same slave? */
   {
      memset(context->esimap, 0x00, EC_MAXEEPBITMAP); /* clear esibuf cache map */
      context->esislave = slave;
   }
   if (address < EC_MAXEEPBUF)
   {
      mapw = address >> 5;
      mapb = address - (mapw << 5);
      if (context->esimap[mapw] & (uint32)(1 << mapb))
      {
         /* byte is already in buffer */
         retval = context->esibuf[address];
      }
      else
      {
         /* byte is not in buffer, put it there */
         configadr = context->slavelist[slave].configadr;
         ecx_eeprom2master(context, slave); /* set eeprom control to master */
         eadr = address >> 1;
         edat = ecx_readeepromFP (context, configadr, eadr, EC_TIMEOUTEEP);
         /* 8 byte response */
         if (context->slavelist[slave].eep_8byte)
         {
            put_unaligned64(edat, &(context->esibuf[eadr << 1]));
            cnt = 8;
         }
         /* 4 byte response */
         else
         {
            put_unaligned32(edat, &(context->esibuf[eadr << 1]));
            cnt = 4;
         }
         /* find bitmap location */
         mapw = eadr >> 4;
         mapb = (eadr << 1) - (mapw << 5);
         for(lp = 0 ; lp < cnt ; lp++)
         {
            /* set bitmap for each byte that is read */
            context->esimap[mapw] |= (1 << mapb);
            mapb++;
            if (mapb > 31)
            {
               mapb = 0;
               mapw++;
            }
         }
         retval = context->esibuf[address];
      }
   }

   return retval;
}